

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall t_xml_generator::iterate_program(t_xml_generator *this,t_program *program)

{
  t_program *this_00;
  bool bVar1;
  uint uVar2;
  string *psVar3;
  vector<t_program_*,_std::allocator<t_program_*>_> *pvVar4;
  pointer ppVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar6;
  vector<t_const_*,_std::allocator<t_const_*>_> *__x;
  reference pptVar7;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> *__x_00;
  reference pptVar8;
  vector<t_enum_*,_std::allocator<t_enum_*>_> *__x_01;
  reference pptVar9;
  vector<t_struct_*,_std::allocator<t_struct_*>_> *__x_02;
  reference pptVar10;
  vector<t_service_*,_std::allocator<t_service_*>_> *__x_03;
  reference pptVar11;
  reference pptVar12;
  size_type sVar13;
  __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
  local_418;
  t_program **local_410;
  __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
  local_408;
  const_iterator prog_it;
  vector<t_program_*,_std::allocator<t_program_*>_> programs;
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_3d8
  ;
  t_service **local_3d0;
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_3c8
  ;
  iterator sv_iter;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_> local_398;
  iterator o_iter;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_368;
  iterator en_iter;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_> local_338
  ;
  iterator td_iter;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_308;
  iterator c_iter;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  string local_2b8;
  allocator local_291;
  string local_290;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  _Self local_200;
  _Base_ptr local_1f8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  const_iterator ns_it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *namespaces;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
  local_170;
  t_program **local_168;
  __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
  local_160;
  const_iterator inc_it;
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  string targetNamespace;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  t_program *local_18;
  t_program *program_local;
  t_xml_generator *this_local;
  
  local_18 = program;
  program_local = (t_program *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"document",&local_39);
  write_element_start(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"name",&local_71);
  psVar3 = t_program::get_name_abi_cxx11_(local_18);
  std::__cxx11::string::string
            ((string *)(targetNamespace.field_2._M_local_buf + 8),(string *)psVar3);
  write_attribute(this,&local_70,(string *)((long)&targetNamespace.field_2 + 8));
  std::__cxx11::string::~string((string *)(targetNamespace.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if ((this->should_use_namespaces_ & 1U) != 0) {
    target_namespace_abi_cxx11_((string *)local_b8,this,local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"targetNamespace",&local_d9);
    std::__cxx11::string::string((string *)&local_100,(string *)local_b8);
    write_attribute(this,&local_d8,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    psVar3 = t_program::get_name_abi_cxx11_(local_18);
    std::operator+(&local_120,"xmlns:",psVar3);
    std::__cxx11::string::string
              ((string *)
               &includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)local_b8);
    write_attribute(this,&local_120,
                    (string *)
                    &includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)local_b8);
  }
  write_doc(this,&local_18->super_t_doc);
  pvVar4 = t_program::get_includes(local_18);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)&inc_it,pvVar4);
  __gnu_cxx::
  __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
  __normal_iterator(&local_160);
  local_168 = (t_program **)
              std::vector<t_program_*,_std::allocator<t_program_*>_>::begin
                        ((vector<t_program_*,_std::allocator<t_program_*>_> *)&inc_it);
  local_160._M_current = local_168;
  while( true ) {
    local_170._M_current =
         (t_program **)
         std::vector<t_program_*,_std::allocator<t_program_*>_>::end
                   ((vector<t_program_*,_std::allocator<t_program_*>_> *)&inc_it);
    bVar1 = __gnu_cxx::operator!=(&local_160,&local_170);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"include",&local_191);
    write_element_start(this,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"name",&local_1b9);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
               ::operator*(&local_160);
    psVar3 = t_program::get_name_abi_cxx11_(*pptVar12);
    std::__cxx11::string::string((string *)&namespaces,(string *)psVar3);
    write_attribute(this,&local_1b8,(string *)&namespaces);
    std::__cxx11::string::~string((string *)&namespaces);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    write_element_end(this);
    __gnu_cxx::
    __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
    operator++(&local_160);
  }
  ns_it._M_node = (_Base_ptr)t_program::get_namespaces_abi_cxx11_(local_18);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&local_1f0);
  local_1f8 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin(ns_it._M_node);
  local_1f0._M_node = local_1f8;
  while( true ) {
    local_200._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(ns_it._M_node);
    bVar1 = std::operator!=(&local_1f0,&local_200);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,"namespace",&local_221);
    write_element_start(this,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_248,"name",&local_249);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_1f0);
    std::__cxx11::string::string((string *)&local_270,(string *)ppVar5);
    write_attribute(this,&local_248,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_290,"value",&local_291);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_1f0);
    std::__cxx11::string::string((string *)&local_2b8,(string *)&ppVar5->second);
    write_attribute(this,&local_290,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    this_00 = local_18;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_1f0);
    pmVar6 = t_program::get_namespace_annotations(this_00,&ppVar5->first);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pmVar6);
    generate_annotations
              (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    write_element_end(this);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_1f0);
  }
  __x = t_program::get_consts(local_18);
  std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
            ((vector<t_const_*,_std::allocator<t_const_*>_> *)&c_iter,__x);
  __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
  __normal_iterator(&local_308);
  local_308._M_current =
       (t_const **)
       std::vector<t_const_*,_std::allocator<t_const_*>_>::begin
                 ((vector<t_const_*,_std::allocator<t_const_*>_> *)&c_iter);
  while( true ) {
    typedefs.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<t_const_*,_std::allocator<t_const_*>_>::end
                            ((vector<t_const_*,_std::allocator<t_const_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_308,
                       (__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                        *)&typedefs.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
              operator*(&local_308);
    generate_constant(this,*pptVar7);
    __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
    operator++(&local_308);
  }
  __x_00 = t_program::get_typedefs(local_18);
  std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
            ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter,__x_00);
  __gnu_cxx::
  __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
  __normal_iterator(&local_338);
  local_338._M_current =
       (t_typedef **)
       std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::begin
                 ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
  while( true ) {
    enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::end
                            ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_338,
                       (__normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
                        *)&enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
              ::operator*(&local_338);
    (*(this->super_t_generator)._vptr_t_generator[0x12])(this,*pptVar8);
    __gnu_cxx::
    __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
    operator++(&local_338);
  }
  __x_01 = t_program::get_enums(local_18);
  std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
            ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter,__x_01);
  __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
  __normal_iterator(&local_368);
  local_368._M_current =
       (t_enum **)
       std::vector<t_enum_*,_std::allocator<t_enum_*>_>::begin
                 ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
  while( true ) {
    objects.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::end
                            ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_368,
                       (__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                        *)&objects.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pptVar9 = __gnu_cxx::
              __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
              operator*(&local_368);
    (*(this->super_t_generator)._vptr_t_generator[0x13])(this,*pptVar9);
    __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
    operator++(&local_368);
  }
  __x_02 = t_program::get_objects(local_18);
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
            ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter,__x_02);
  __gnu_cxx::__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>::
  __normal_iterator(&local_398);
  local_398._M_current =
       (t_struct **)
       std::vector<t_struct_*,_std::allocator<t_struct_*>_>::begin
                 ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
  while( true ) {
    services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<t_struct_*,_std::allocator<t_struct_*>_>::end
                            ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_398,
                       (__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                        *)&services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
               ::operator*(&local_398);
    uVar2 = (*((*pptVar10)->super_t_type).super_t_doc._vptr_t_doc[0xc])();
    if ((uVar2 & 1) == 0) {
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                 ::operator*(&local_398);
      (*(this->super_t_generator)._vptr_t_generator[0x15])(this,*pptVar10);
    }
    else {
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                 ::operator*(&local_398);
      (*(this->super_t_generator)._vptr_t_generator[0x18])(this,*pptVar10);
    }
    __gnu_cxx::__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
    ::operator++(&local_398);
  }
  __x_03 = t_program::get_services(local_18);
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter,__x_03);
  __gnu_cxx::
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
  __normal_iterator(&local_3c8);
  local_3d0 = (t_service **)
              std::vector<t_service_*,_std::allocator<t_service_*>_>::begin
                        ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
  local_3c8._M_current = local_3d0;
  while( true ) {
    local_3d8._M_current =
         (t_service **)
         std::vector<t_service_*,_std::allocator<t_service_*>_>::end
                   ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
    bVar1 = __gnu_cxx::operator!=(&local_3c8,&local_3d8);
    if (!bVar1) break;
    pptVar11 = __gnu_cxx::
               __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
               ::operator*(&local_3c8);
    (*(this->super_t_generator)._vptr_t_generator[0x16])(this,*pptVar11);
    __gnu_cxx::
    __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
    operator++(&local_3c8);
  }
  write_element_end(this);
  if ((this->should_merge_includes_ & 1U) != 0) {
    psVar3 = t_program::get_name_abi_cxx11_(local_18);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->programs_,psVar3);
    pvVar4 = t_program::get_includes(local_18);
    std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
              ((vector<t_program_*,_std::allocator<t_program_*>_> *)&prog_it,pvVar4);
    __gnu_cxx::
    __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
    __normal_iterator(&local_408);
    local_410 = (t_program **)
                std::vector<t_program_*,_std::allocator<t_program_*>_>::begin
                          ((vector<t_program_*,_std::allocator<t_program_*>_> *)&prog_it);
    local_408._M_current = local_410;
    while( true ) {
      local_418._M_current =
           (t_program **)
           std::vector<t_program_*,_std::allocator<t_program_*>_>::end
                     ((vector<t_program_*,_std::allocator<t_program_*>_> *)&prog_it);
      bVar1 = __gnu_cxx::operator!=(&local_408,&local_418);
      if (!bVar1) break;
      pptVar12 = __gnu_cxx::
                 __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                 ::operator*(&local_408);
      psVar3 = t_program::get_name_abi_cxx11_(*pptVar12);
      sVar13 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&this->programs_,psVar3);
      if (sVar13 == 0) {
        pptVar12 = __gnu_cxx::
                   __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                   ::operator*(&local_408);
        iterate_program(this,*pptVar12);
      }
      __gnu_cxx::
      __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
      ::operator++(&local_408);
    }
    std::vector<t_program_*,_std::allocator<t_program_*>_>::~vector
              ((vector<t_program_*,_std::allocator<t_program_*>_> *)&prog_it);
  }
  std::vector<t_service_*,_std::allocator<t_service_*>_>::~vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::~vector
            ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
  std::vector<t_enum_*,_std::allocator<t_enum_*>_>::~vector
            ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
  std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::~vector
            ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
  std::vector<t_const_*,_std::allocator<t_const_*>_>::~vector
            ((vector<t_const_*,_std::allocator<t_const_*>_> *)&c_iter);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::~vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)&inc_it);
  return;
}

Assistant:

void t_xml_generator::iterate_program(t_program* program) {

  write_element_start("document");
  write_attribute("name", program->get_name());
  if (should_use_namespaces_) {
    const string targetNamespace = target_namespace(program);
    write_attribute("targetNamespace", targetNamespace);
    write_attribute("xmlns:" + program->get_name(), targetNamespace);
  }
  write_doc(program);

  const vector<t_program*> includes = program->get_includes();
  vector<t_program*>::const_iterator inc_it;
  for (inc_it = includes.begin(); inc_it != includes.end(); ++inc_it) {
    write_element_start("include");
    write_attribute("name", (*inc_it)->get_name());
    write_element_end();
  }

  const map<string, string>& namespaces = program->get_namespaces();
  map<string, string>::const_iterator ns_it;
  for (ns_it = namespaces.begin(); ns_it != namespaces.end(); ++ns_it) {
    write_element_start("namespace");
    write_attribute("name", ns_it->first);
    write_attribute("value", ns_it->second);
    generate_annotations(program->get_namespace_annotations(ns_it->first));
    write_element_end();
  }

  // TODO: can constants have annotations?
  vector<t_const*> consts = program->get_consts();
  vector<t_const*>::iterator c_iter;
  for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
    generate_constant(*c_iter);
  }

  vector<t_typedef*> typedefs = program->get_typedefs();
  vector<t_typedef*>::iterator td_iter;
  for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
    generate_typedef(*td_iter);
  }

  vector<t_enum*> enums = program->get_enums();
  vector<t_enum*>::iterator en_iter;
  for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
    generate_enum(*en_iter);
  }

  vector<t_struct*> objects = program->get_objects();
  vector<t_struct*>::iterator o_iter;
  for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
    if ((*o_iter)->is_xception()) {
      generate_xception(*o_iter);
    } else {
      generate_struct(*o_iter);
    }
  }

  vector<t_service*> services = program->get_services();
  vector<t_service*>::iterator sv_iter;
  for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
    generate_service(*sv_iter);
  }

  write_element_end();

  if (should_merge_includes_) {
    programs_.insert(program->get_name());
    const vector<t_program*> programs = program->get_includes();
    vector<t_program*>::const_iterator prog_it;
    for (prog_it = programs.begin(); prog_it != programs.end(); ++prog_it) {
      if (!programs_.count((*prog_it)->get_name())) {
        iterate_program(*prog_it);
      }
    }
  }

}